

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.cpp
# Opt level: O1

ktx_error_code_e
ktxUncompressZLIBInt(uchar *pDest,ktx_size_t *pDestLength,uchar *pSrc,ktx_size_t srcLength)

{
  ktx_error_code_e kVar1;
  int iVar2;
  mz_ulong mzUncompressedSize;
  ulong local_10;
  
  local_10 = *pDestLength;
  kVar1 = KTX_INVALID_VALUE;
  if ((local_10 | srcLength) >> 0x20 == 0) {
    iVar2 = buminiz::mz_uncompress(pDest,&local_10,pSrc,srcLength);
    if (iVar2 == -5) {
      kVar1 = KTX_DECOMPRESS_LENGTH_ERROR;
    }
    else if (iVar2 == -4) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else if (iVar2 == 0) {
      *pDestLength = local_10;
      kVar1 = KTX_SUCCESS;
    }
    else {
      kVar1 = KTX_FILE_DATA_ERROR;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code ktxUncompressZLIBInt(unsigned char* pDest,
                                    ktx_size_t* pDestLength,
                                    const unsigned char* pSrc,
                                    ktx_size_t srcLength) {
    if ((srcLength | *pDestLength) > 0xFFFFFFFFU) return KTX_INVALID_VALUE;
    mz_ulong mzUncompressedSize = (mz_ulong)*pDestLength;
    int status = mz_uncompress(pDest, &mzUncompressedSize, pSrc, (mz_ulong)srcLength);
    switch (status) {
    case MZ_OK:
        *pDestLength = mzUncompressedSize;
        return KTX_SUCCESS;
    case MZ_BUF_ERROR:
        return KTX_DECOMPRESS_LENGTH_ERROR; // buffer too small
    case MZ_MEM_ERROR:
        return KTX_OUT_OF_MEMORY;
    default:
        return KTX_FILE_DATA_ERROR;
    }
}